

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

ConstPixelBufferAccess * __thiscall
sglr::ReferenceContext::getUnpack2DAccess
          (ConstPixelBufferAccess *__return_storage_ptr__,ReferenceContext *this,
          TextureFormat *format,int width,int height,void *data)

{
  int iVar1;
  int iVar2;
  uint rowPitch;
  
  iVar1 = tcu::TextureFormat::getPixelSize(format);
  iVar2 = this->m_pixelUnpackRowLength;
  if (this->m_pixelUnpackRowLength < 1) {
    iVar2 = width;
  }
  rowPitch = -this->m_pixelUnpackAlignment & (iVar2 * iVar1 + this->m_pixelUnpackAlignment) - 1U;
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (__return_storage_ptr__,format,width,height,1,rowPitch,0,
             (void *)((long)data +
                     (long)(int)(this->m_pixelUnpackSkipRows * rowPitch) +
                     (long)(iVar1 * this->m_pixelUnpackSkipPixels)));
  return __return_storage_ptr__;
}

Assistant:

tcu::ConstPixelBufferAccess ReferenceContext::getUnpack2DAccess (const tcu::TextureFormat& format, int width, int height, const void* data)
{
	int				pixelSize	= format.getPixelSize();
	int				rowLen		= m_pixelUnpackRowLength > 0 ? m_pixelUnpackRowLength : width;
	int				rowPitch	= deAlign32(rowLen*pixelSize, m_pixelUnpackAlignment);
	const deUint8*	ptr			= (const deUint8*)data + m_pixelUnpackSkipRows*rowPitch + m_pixelUnpackSkipPixels*pixelSize;

	return tcu::ConstPixelBufferAccess(format, width, height, 1, rowPitch, 0, ptr);
}